

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLineNurbs::Derive(ChLineNurbs *this,ChVector<double> *dir,double parU)

{
  double *pdVar1;
  pointer pCVar2;
  int iVar3;
  Scalar *pSVar4;
  int iVar5;
  long lVar6;
  long index;
  double u;
  ChVectorDynamic<> mdR;
  ChVectorDynamic<> mR;
  ChVector<double> v;
  Matrix<double,__1,_1,_0,__1,_1> local_68;
  Matrix<double,__1,_1,_0,__1,_1> local_58;
  ChVector<double> local_48;
  
  u = ComputeKnotUfromU(this,parU);
  local_48.m_data[0]._0_4_ = this->p + 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_58,(int *)&local_48);
  local_48.m_data[0] = (double)CONCAT44(local_48.m_data[0]._4_4_,this->p + 1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_68,(int *)&local_48);
  ChBasisToolsNurbs::BasisEvaluateDeriv(this->p,u,&this->weights,&this->knots,&local_58,&local_68);
  iVar3 = ChBasisToolsBspline::FindSpan(this->p,u,&this->knots);
  if (dir != (ChVector<double> *)&VNULL) {
    dir->m_data[0] = VNULL;
    dir->m_data[1] = DAT_011dd3e0;
    dir->m_data[2] = DAT_011dd3e8;
  }
  iVar5 = this->p;
  lVar6 = (long)(iVar3 - iVar5) * 0x18 + 0x10;
  for (index = 0; index <= iVar5; index = index + 1) {
    pCVar2 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_68,
                        index);
    local_48.m_data[2] = *pSVar4;
    pdVar1 = (double *)((long)pCVar2->m_data + lVar6 + -0x10);
    local_48.m_data[0] = local_48.m_data[2] * *pdVar1;
    local_48.m_data[1] = local_48.m_data[2] * pdVar1[1];
    local_48.m_data[2] = local_48.m_data[2] * *(double *)((long)pCVar2->m_data + lVar6);
    ChVector<double>::operator+=(dir,&local_48);
    iVar5 = this->p;
    lVar6 = lVar6 + 0x18;
  }
  Eigen::internal::handmade_aligned_free
            (local_68.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChLineNurbs::Derive(ChVector<>& dir, const double parU) const {
    double u = ComputeKnotUfromU(parU);

    ChVectorDynamic<> mR(this->p + 1);
    ChVectorDynamic<> mdR(this->p + 1);
    ChBasisToolsNurbs::BasisEvaluateDeriv(this->p, u, this->weights, this->knots, mR, mdR);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    dir = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        dir += points[uind + i] * mdR(i);
    }
}